

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O1

void Js::StringProfiler::PrintOneConcat(UintUintPair *key,ConcatMetrics *metrics)

{
  PrintUintOrLarge(key->first);
  Output::Print(L" ");
  PrintUintOrLarge(key->second);
  Output::Print(L" %6u",(ulong)metrics->compoundStringCount);
  Output::Print(L" %6u",(ulong)metrics->concatTreeCount);
  Output::Print(L" %6u",(ulong)metrics->bufferStringBuilderCount);
  Output::Print(L" %6u",(ulong)metrics->unknownCount);
  Output::Print(L" %6u\n",
                (ulong)(metrics->concatTreeCount + metrics->compoundStringCount +
                        metrics->bufferStringBuilderCount + metrics->unknownCount));
  return;
}

Assistant:

void StringProfiler::PrintOneConcat( UintUintPair const& key, const ConcatMetrics& metrics)
    {
        PrintUintOrLarge(key.first);
        Output::Print(_u(" "));
        PrintUintOrLarge(key.second);
        Output::Print(_u(" %6u"), metrics.compoundStringCount);
        Output::Print(_u(" %6u"), metrics.concatTreeCount);
        Output::Print(_u(" %6u"), metrics.bufferStringBuilderCount);
        Output::Print(_u(" %6u"), metrics.unknownCount);
        Output::Print(_u(" %6u\n"), metrics.Total());
    }